

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O1

bool __thiscall sing::HttpContext::parseRequest(HttpContext *this)

{
  HttpRequestParseState HVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  char *colon;
  bool bVar6;
  undefined1 local_41;
  undefined2 local_40;
  undefined1 local_3e [2];
  undefined2 local_3c;
  undefined1 local_3a [2];
  HttpRequest *local_38;
  
  local_38 = &this->request;
  bVar3 = true;
  bVar6 = true;
  do {
    HVar1 = this->state;
    if (HVar1 == BODY) {
      this->state = FINSH;
LAB_0010a1d7:
      bVar4 = false;
    }
    else if (HVar1 == HEADERS) {
      local_3a[0] = 0;
      local_3c = 0xa0d;
      pcVar2 = (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (pcVar2 + (this->input).readIndex,pcVar2 + (this->input).writeIndex,
                          &local_3c,local_3a);
      bVar4 = false;
      if ((pcVar5 != (char *)0x0) &&
         (pcVar2 = (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start, pcVar5 != pcVar2 + (this->input).writeIndex)) {
        local_41 = 0x3a;
        colon = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar2 + (this->input).readIndex,pcVar5,&local_41);
        if (colon == pcVar5) {
          this->state = BODY;
          bVar4 = true;
        }
        else {
          HttpRequest::addHeader
                    (local_38,(this->input).buffer.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start + (this->input).readIndex,
                     colon,pcVar5);
          bVar4 = bVar6;
        }
        Buffer::retrieveUntil(&this->input,pcVar5 + 2);
      }
    }
    else {
      bVar4 = bVar6;
      if (HVar1 == REQUEST_LINE) {
        local_3e[0] = 0;
        local_40 = 0xa0d;
        pcVar2 = (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar5 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (pcVar2 + (this->input).readIndex,pcVar2 + (this->input).writeIndex,
                            &local_40,local_3e);
        bVar4 = false;
        if ((pcVar5 != (char *)0x0) &&
           (pcVar2 = (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start, bVar4 = false,
           pcVar5 != pcVar2 + (this->input).writeIndex)) {
          bVar3 = parseRequestLine(this,pcVar2 + (this->input).readIndex,pcVar5);
          if (!bVar3) goto LAB_0010a1d7;
          Buffer::retrieveUntil(&this->input,pcVar5 + 2);
          this->state = HEADERS;
          bVar4 = bVar6;
        }
      }
    }
    bVar6 = bVar4;
    if (!bVar4) {
      return bVar3;
    }
  } while( true );
}

Assistant:

bool HttpContext::parseRequest(){
    bool ok = true;
    bool hasMore = true;
    while (hasMore)
    {
        if (state == REQUEST_LINE)
        {
            const char* crlf = input.findCRLF();
            if(crlf){
                ok = parseRequestLine(input.peek(),crlf);
                if(ok){
                    input.retrieveUntil(crlf + 2);
                    state = HEADERS;
                }else{
                    hasMore = false;
                }
            }else{
                hasMore = false;
            }

        }else if (state == HEADERS)
        {
            const char* crlf = input.findCRLF();
            if(crlf){
                const char* colon = std::find(input.peek(),crlf,':');
                if(colon!=crlf){
                    request.addHeader(input.peek(),colon,crlf);
                }else{
                    state = BODY;
                    hasMore = true;
                }
                input.retrieveUntil(crlf + 2);

            }else{
                hasMore = false;
            }

        }else if (state==BODY)
        {
            //TO ADD: process requestbody
            state = FINSH;
            hasMore = false;
        }
    }

    return ok;
}